

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O3

ostream * operator<<(ostream *os,TimeRepresentation<count_time<9,_long>_> *t1)

{
  ostream *poVar1;
  char local_9;
  
  poVar1 = std::ostream::_M_insert<double>
                     ((double)(t1->internalTimeCode % 1000000000) * 1e-09 +
                      (double)(t1->internalTimeCode / 1000000000));
  local_9 = 's';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_9,1);
  return os;
}

Assistant:

std::ostream&
        operator<<(std::ostream& os, const TimeRepresentation& t1)
    {
        os << Tconv::toDouble(t1.internalTimeCode) << 's';
        return os;
    }